

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapimin.c
# Opt level: O0

int jpeg_consume_input(j_decompress_ptr cinfo)

{
  long *in_RDI;
  int retcode;
  int local_c;
  
  local_c = 0;
  switch(*(undefined4 *)((long)in_RDI + 0x24)) {
  case 200:
    (**(code **)(in_RDI[0x48] + 8))(in_RDI);
    (**(code **)(in_RDI[5] + 0x10))(in_RDI);
    *(undefined4 *)((long)in_RDI + 0x24) = 0xc9;
  case 0xc9:
    local_c = (**(code **)in_RDI[0x48])(in_RDI);
    if (local_c == 1) {
      default_decompress_parms(cinfo);
      *(undefined4 *)((long)in_RDI + 0x24) = 0xca;
    }
    break;
  case 0xca:
    local_c = 1;
    break;
  case 0xcb:
  case 0xcc:
  case 0xcd:
  case 0xce:
  case 0xcf:
  case 0xd0:
  case 0xd2:
    local_c = (**(code **)in_RDI[0x48])(in_RDI);
    break;
  default:
    *(undefined4 *)(*in_RDI + 0x28) = 0x14;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  return local_c;
}

Assistant:

GLOBAL(int)
jpeg_consume_input(j_decompress_ptr cinfo)
{
  int retcode = JPEG_SUSPENDED;

  /* NB: every possible DSTATE value should be listed in this switch */
  switch (cinfo->global_state) {
  case DSTATE_START:
    /* Start-of-datastream actions: reset appropriate modules */
    (*cinfo->inputctl->reset_input_controller) (cinfo);
    /* Initialize application's data source module */
    (*cinfo->src->init_source) (cinfo);
    cinfo->global_state = DSTATE_INHEADER;
    FALLTHROUGH                 /*FALLTHROUGH*/
  case DSTATE_INHEADER:
    retcode = (*cinfo->inputctl->consume_input) (cinfo);
    if (retcode == JPEG_REACHED_SOS) { /* Found SOS, prepare to decompress */
      /* Set up default parameters based on header data */
      default_decompress_parms(cinfo);
      /* Set global state: ready for start_decompress */
      cinfo->global_state = DSTATE_READY;
    }
    break;
  case DSTATE_READY:
    /* Can't advance past first SOS until start_decompress is called */
    retcode = JPEG_REACHED_SOS;
    break;
  case DSTATE_PRELOAD:
  case DSTATE_PRESCAN:
  case DSTATE_SCANNING:
  case DSTATE_RAW_OK:
  case DSTATE_BUFIMAGE:
  case DSTATE_BUFPOST:
  case DSTATE_STOPPING:
    retcode = (*cinfo->inputctl->consume_input) (cinfo);
    break;
  default:
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  }
  return retcode;
}